

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::InferDependencies(cmComputeLinkDepends *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppDVar3;
  reference pvVar4;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_00;
  size_type sVar5;
  reference __args;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  cVar6;
  insert_iterator<cmComputeLinkDepends::DependSet> __result;
  cmListFileBacktrace local_158;
  bool local_141;
  reference local_140;
  int *c;
  iterator __end2_1;
  iterator __begin2_1;
  DependSet *__range2_1;
  cmGraphEdgeList *edges;
  undefined1 local_d0 [8];
  DependSet intersection;
  DependSet *i;
  __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
  __end2;
  __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
  __begin2;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  local_78;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  local_68;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  *local_58;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  *__range2;
  DependSet common;
  DependSetList *sets;
  uint depender_index;
  cmComputeLinkDepends *this_local;
  
  sets._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
            ::size(&this->InferredDependSets);
    if (sVar2 <= sets._4_4_) break;
    ppDVar3 = std::
              vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ::operator[](&this->InferredDependSets,(ulong)sets._4_4_);
    common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.super__Rb_tree_header.
    _M_node_count = (size_t)*ppDVar3;
    if ((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_> *
        )common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
         super__Rb_tree_header._M_node_count !=
        (vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_> *
        )0x0) {
      bVar1 = std::
              vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ::empty((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       *)common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                         super__Rb_tree_header._M_node_count);
      if (!bVar1) {
        pvVar4 = std::
                 vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                 ::front((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                          *)common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl
                            .super__Rb_tree_header._M_node_count);
        DependSet::DependSet((DependSet *)&__range2,pvVar4);
        cVar6 = cmMakeRange<cmComputeLinkDepends::DependSetList>
                          ((DependSetList *)
                           common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                           super__Rb_tree_header._M_node_count);
        local_78 = cVar6;
        cVar6 = cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
                ::advance(&local_78,1);
        local_58 = &local_68;
        local_68 = cVar6;
        __end2 = cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
                 ::begin(local_58);
        i = (DependSet *)
            cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
            ::end(local_58);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                                      *)&i);
          if (!bVar1) break;
          intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
          super__Rb_tree_header._M_node_count =
               (size_t)__gnu_cxx::
                       __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                       ::operator*(&__end2);
          DependSet::DependSet((DependSet *)local_d0);
          __first1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
          __last1 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
          __first2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)
                                intersection.super_set<int,_std::less<int>,_std::allocator<int>_>.
                                _M_t._M_impl.super__Rb_tree_header._M_node_count);
          __last2 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                              ((set<int,_std::less<int>,_std::allocator<int>_> *)
                               intersection.super_set<int,_std::less<int>,_std::allocator<int>_>.
                               _M_t._M_impl.super__Rb_tree_header._M_node_count);
          __i = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_d0);
          __result = std::inserter<cmComputeLinkDepends::DependSet>((DependSet *)local_d0,__i);
          std::
          set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<cmComputeLinkDepends::DependSet>>
                    ((_Rb_tree_const_iterator<int>)__first1._M_node,
                     (_Rb_tree_const_iterator<int>)__last1._M_node,
                     (_Rb_tree_const_iterator<int>)__first2._M_node,
                     (_Rb_tree_const_iterator<int>)__last2._M_node,__result);
          DependSet::operator=((DependSet *)&__range2,(DependSet *)local_d0);
          DependSet::~DependSet((DependSet *)local_d0);
          __gnu_cxx::
          __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
          ::operator++(&__end2);
        }
        this_00 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->EntryConstraintGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (ulong)sets._4_4_);
        sVar2 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::size
                          ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00);
        sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::reserve
                  ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00,sVar2 + sVar5);
        __end2_1 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
        c = (int *)std::set<int,_std::less<int>,_std::allocator<int>_>::end
                             ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range2);
        while( true ) {
          bVar1 = std::operator!=(&__end2_1,(_Self *)&c);
          if (!bVar1) break;
          __args = std::_Rb_tree_const_iterator<int>::operator*(&__end2_1);
          local_141 = true;
          local_158.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_158.TopEntry.
          super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_140 = __args;
          cmListFileBacktrace::cmListFileBacktrace(&local_158);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<int_const&,bool,cmListFileBacktrace>(this_00,__args,&local_141,&local_158);
          cmListFileBacktrace::~cmListFileBacktrace(&local_158);
          std::_Rb_tree_const_iterator<int>::operator++(&__end2_1);
        }
        DependSet::~DependSet((DependSet *)&__range2);
      }
    }
    sets._4_4_ = sets._4_4_ + 1;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::InferDependencies()
{
  // The inferred dependency sets for each item list the possible
  // dependencies.  The intersection of the sets for one item form its
  // inferred dependencies.
  for (unsigned int depender_index = 0;
       depender_index < this->InferredDependSets.size(); ++depender_index) {
    // Skip items for which dependencies do not need to be inferred or
    // for which the inferred dependency sets are empty.
    DependSetList* sets = this->InferredDependSets[depender_index];
    if (!sets || sets->empty()) {
      continue;
    }

    // Intersect the sets for this item.
    DependSet common = sets->front();
    for (DependSet const& i : cmMakeRange(*sets).advance(1)) {
      DependSet intersection;
      std::set_intersection(common.begin(), common.end(), i.begin(), i.end(),
                            std::inserter(intersection, intersection.begin()));
      common = intersection;
    }

    // Add the inferred dependencies to the graph.
    cmGraphEdgeList& edges = this->EntryConstraintGraph[depender_index];
    edges.reserve(edges.size() + common.size());
    for (auto const& c : common) {
      edges.emplace_back(c, true, cmListFileBacktrace());
    }
  }
}